

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_error.h
# Opt level: O3

void __thiscall
jsonnet::internal::StaticError::StaticError
          (StaticError *this,string *filename,Location *location,string *msg)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  pointer pcVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  unsigned_long uVar6;
  
  uVar1 = location->line;
  uVar2 = location->column;
  (this->location).file._M_dataplus._M_p = (pointer)&(this->location).file.field_2;
  pcVar3 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar3,pcVar3 + filename->_M_string_length);
  uVar4 = *(undefined4 *)((long)&location->line + 4);
  uVar6 = location->column;
  uVar5 = *(undefined4 *)((long)&location->column + 4);
  *(int *)&(this->location).begin.line = (int)location->line;
  *(undefined4 *)((long)&(this->location).begin.line + 4) = uVar4;
  *(int *)&(this->location).begin.column = (int)uVar6;
  *(undefined4 *)((long)&(this->location).begin.column + 4) = uVar5;
  (this->location).end.line = uVar1;
  (this->location).end.column = uVar2 + 1;
  (this->msg)._M_dataplus._M_p = (pointer)&(this->msg).field_2;
  pcVar3 = (msg->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->msg,pcVar3,pcVar3 + msg->_M_string_length);
  return;
}

Assistant:

StaticError(const std::string &filename, const Location &location, const std::string &msg)
        : location(filename, location, location.successor()), msg(msg)
    {
    }